

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void swapBytes(uchar *var,int size)

{
  uchar uVar1;
  int local_1c;
  int iStack_18;
  char c;
  int j;
  int i;
  int size_local;
  uchar *var_local;
  
  local_1c = size + -1;
  for (iStack_18 = 0; iStack_18 < local_1c; iStack_18 = iStack_18 + 1) {
    uVar1 = var[iStack_18];
    var[iStack_18] = var[local_1c];
    var[local_1c] = uVar1;
    local_1c = local_1c + -1;
  }
  return;
}

Assistant:

void swapBytes(unsigned char* var, int size)
{
  int i = 0;
  int j = size - 1;
  char c;

  while (i < j) {
    c = var[i]; var[i] = var[j]; var[j] = c;
    i++, j--;
  }
}